

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism_base.cpp
# Opt level: O2

int __thiscall
zmq::mechanism_base_t::check_basic_command_structure(mechanism_base_t *this,msg_t *msg_)

{
  size_t sVar1;
  byte *pbVar2;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  int *piVar3;
  
  sVar1 = msg_t::size(msg_);
  if (1 < sVar1) {
    sVar1 = msg_t::size(msg_);
    pbVar2 = (byte *)msg_t::data(msg_);
    if (*pbVar2 < sVar1) {
      return 0;
    }
  }
  this_00 = session_base_t::get_socket(this->session);
  endpoint_uri_pair_ = session_base_t::get_endpoint(this->session);
  socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x10000011);
  piVar3 = __errno_location();
  *piVar3 = 0x47;
  return -1;
}

Assistant:

int zmq::mechanism_base_t::check_basic_command_structure (msg_t *msg_) const
{
    if (msg_->size () <= 1
        || msg_->size () <= (static_cast<uint8_t *> (msg_->data ()))[0]) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_UNSPECIFIED);
        errno = EPROTO;
        return -1;
    }
    return 0;
}